

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O2

void duckdb::ReadDataFromStructSegment
               (ListSegmentFunctions *functions,ListSegment *segment,Vector *result,
               idx_t *total_count)

{
  ushort uVar1;
  ListSegment *pLVar2;
  read_data_from_segment_t p_Var3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  const_reference pvVar4;
  reference this_00;
  type pVVar5;
  idx_t i;
  ulong uVar6;
  idx_t child_count;
  
  FlatVector::VerifyFlatVector(result);
  for (uVar6 = 0; uVar6 < segment->count; uVar6 = uVar6 + 1) {
    if (*(char *)((long)&segment[1].count + uVar6) == '\x01') {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,*total_count + uVar6
                );
    }
  }
  this = StructVector::GetEntries(result);
  uVar1 = segment->capacity;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(this->
                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->
                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    pLVar2 = *(ListSegment **)((long)&segment[1].count + uVar6 * 8 + (ulong)uVar1);
    pvVar4 = vector<duckdb::ListSegmentFunctions,_true>::get<true>
                       (&functions->child_functions,uVar6);
    p_Var3 = pvVar4->read_data;
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this,uVar6);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (this_00);
    (*p_Var3)(pvVar4,pLVar2,pVVar5,total_count);
  }
  return;
}

Assistant:

static void ReadDataFromStructSegment(const ListSegmentFunctions &functions, const ListSegment *segment, Vector &result,
                                      idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto &children = StructVector::GetEntries(result);

	// recurse into the child segments of each child of the struct
	D_ASSERT(children.size() == functions.child_functions.size());
	auto struct_children = GetStructData(segment);
	for (idx_t child_count = 0; child_count < children.size(); child_count++) {
		auto struct_children_segment = Load<ListSegment *>(const_data_ptr_cast(struct_children + child_count));
		auto &child_function = functions.child_functions[child_count];
		child_function.read_data(child_function, struct_children_segment, *children[child_count], total_count);
	}
}